

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<void_*>::dispose(ArrayBuilder<void_*> *this)

{
  void **ppvVar1;
  RemoveConst<void_*> *ppvVar2;
  void **ppvVar3;
  
  ppvVar1 = this->ptr;
  if (ppvVar1 != (void **)0x0) {
    ppvVar2 = this->pos;
    ppvVar3 = this->endPtr;
    this->endPtr = (void **)0x0;
    this->ptr = (void **)0x0;
    this->pos = (RemoveConst<void_*> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppvVar1,8,(long)ppvVar2 - (long)ppvVar1 >> 3,
               (long)ppvVar3 - (long)ppvVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }